

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall
rengine::OpenGLRenderer::drawBlurQuad
          (OpenGLRenderer *this,uint offset,GLuint texId,int radius,vec2 renderSize,vec2 textureSize
          ,vec2 step)

{
  int iVar1;
  Program *pPVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fStack_78;
  float fStack_74;
  vec2 step_local;
  float fStack_68;
  float fStack_64;
  vec2 textureSize_local;
  float fStack_58;
  float fStack_54;
  vec2 renderSize_local;
  
  pPVar2 = this->m_activeShader;
  if ((BlurProgram *)pPVar2 != &this->prog_blur) {
    if (pPVar2 == (Program *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = (pPVar2->super_OpenGLShaderProgram).m_attributeCount;
    }
    iVar1 = (this->prog_blur).super_Program.super_OpenGLShaderProgram.m_attributeCount;
    glUseProgram((this->prog_blur).super_Program.super_OpenGLShaderProgram.m_id);
    iVar4 = iVar3;
    if (iVar3 < iVar1) {
      do {
        glEnableVertexAttribArray(iVar4);
        iVar4 = iVar4 + 1;
      } while (iVar1 != iVar4);
    }
    while (iVar1 < iVar3) {
      iVar3 = iVar3 + -1;
      glDisableVertexAttribArray(iVar3);
    }
    this->m_activeShader = &(this->prog_blur).super_Program;
  }
  if ((this->m_matrixState & 0x20) != 0) {
    this->m_matrixState = this->m_matrixState & 0xffffffdf;
    glUniformMatrix4fv((this->prog_blur).super_Program.matrix,1,1,&this->m_proj);
  }
  glUniform1i((this->prog_blur).radius,radius);
  fStack_58 = renderSize.x;
  fStack_54 = renderSize.y;
  fStack_68 = textureSize.x;
  fStack_64 = textureSize.y;
  glUniform4f(fStack_58,fStack_54,fStack_68,fStack_64,(this->prog_blur).dims);
  fVar5 = (float)radius * 0.3 + 0.8;
  fVar5 = fVar5 * fVar5;
  glUniform1f(fVar5 + fVar5,(this->prog_blur).sigma);
  fStack_78 = step.x;
  fStack_74 = step.y;
  glUniform2f(fStack_78,fStack_74,(this->prog_blur).step);
  glVertexAttribPointer(0,2,0x1406,0,0,(ulong)offset << 3);
  glBindTexture(0xde1,texId);
  glDrawArrays(5,0,4);
  return;
}

Assistant:

inline void OpenGLRenderer::drawBlurQuad(unsigned offset, GLuint texId, int radius, vec2 renderSize, vec2 textureSize, vec2 step)
{
    activateShader(&prog_blur);
    ensureMatrixUpdated(UpdateBlurProgram, &prog_blur);

    glUniform1i(prog_blur.radius, radius);
    glUniform4f(prog_blur.dims, renderSize.x, renderSize.y, textureSize.x, textureSize.y);
    float sigma = 0.3 * radius + 0.8;
    glUniform1f(prog_blur.sigma, sigma * sigma * 2.0);
    glUniform2f(prog_blur.step, step.x, step.y);

    glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, (void *) (offset * sizeof(vec2)));
    glBindTexture(GL_TEXTURE_2D, texId);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
}